

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O0

double __thiscall libDAI::TProb<double>::log(TProb<double> *this,double __x)

{
  value_type_conflict3 *pvVar1;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  size_t i;
  TProb<double> *l;
  value_type_conflict3 *__x_00;
  undefined8 local_30;
  size_type in_stack_ffffffffffffffd8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  
  TProb(this);
  size((TProb<double> *)0xbab8c9);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  local_30 = (value_type_conflict3 *)0x0;
  while (__x_00 = local_30, pvVar1 = (value_type_conflict3 *)size((TProb<double> *)0xbab8f4),
        __x_00 < pvVar1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(size_type)local_30);
    __x = ::log(*pvVar2);
    std::vector<double,_std::allocator<double>_>::push_back(&this->_p,__x_00);
    local_30 = (value_type_conflict3 *)((long)local_30 + 1);
  }
  return __x;
}

Assistant:

TProb<T> log() const {
                TProb<T> l;
                l._p.reserve( size() );
                for( size_t i = 0; i < size(); i++ )
                    l._p.push_back( std::log( _p[i] ) );
                return l;
            }